

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNStat.cpp
# Opt level: O2

void __thiscall NaPNStatistics::initialize(NaPNStatistics *this,bool *starter)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  uint uVar4;
  
  NaVector::init_zero(&this->Mean);
  NaVector::init_zero(&this->RMS);
  NaVector::init_zero(&this->StdDev);
  NaVector::init_zero(&this->Min);
  NaVector::init_zero(&this->Max);
  NaVector::init_zero(&this->Sum);
  NaVector::init_zero(&this->Sum2);
  this->nGapAct = 0;
  iVar1 = (*(this->super_NaPetriNode)._vptr_NaPetriNode[3])(this);
  if ((char)iVar1 != '\0') {
    uVar4 = this->nGapWidth;
    pcVar2 = NaPetriNode::name(&this->super_NaPetriNode);
    if (uVar4 == 0) {
      NaPrintLog("Statistics node \'%s\' has continuous computation\n",pcVar2);
    }
    else {
      NaPrintLog("Statistics node \'%s\' has floating gap %u computation\n",pcVar2,
                 (ulong)this->nGapWidth);
    }
    if ((this->mHalt & 0x3ff) == 0) {
      NaPrintLog("  and does not have halt conditions.\n");
      return;
    }
    uVar4 = 0;
    NaPrintLog("  and has next halt conditions:\n");
    for (lVar3 = 0; lVar3 != 0x50; lVar3 = lVar3 + 8) {
      if (((uint)this->mHalt >> (uVar4 & 0x1f) & 1) != 0) {
        NaPrintLog("  %s[0] %s %g\n",*(undefined8 *)((long)&this->HaltCond[0].value + lVar3 * 2),
                   *(undefined8 *)((long)szId + lVar3),
                   szSign[(long)*(int *)((long)&this->HaltCond[0].sign + lVar3 * 2) + 1]);
      }
      uVar4 = uVar4 + 1;
    }
  }
  return;
}

Assistant:

void
NaPNStatistics::initialize (bool& starter)
{
    Mean.init_zero();
    RMS.init_zero();
    StdDev.init_zero();
    Min.init_zero();
    Max.init_zero();

    Sum.init_zero();
    Sum2.init_zero();

    nGapAct = 0;

    if(is_verbose()){
      if(nGapWidth)
	NaPrintLog("Statistics node '%s' has floating gap %u computation\n",
		   name(), nGapWidth);
      else
	NaPrintLog("Statistics node '%s' has continuous computation\n",
		   name());
      if(mHalt & NaSM_ALL){
	int	id;

	NaPrintLog("  and has next halt conditions:\n");
	for(id = 0; id < NaSI_number; ++id){
	  if(mHalt & NaSIdToMask(id))
	    NaPrintLog("  %s[0] %s %g\n", szId[id],
		       szSign[1 + HaltCond[id].sign], HaltCond[id].value);
	}
      }else
	NaPrintLog("  and does not have halt conditions.\n");
    }
}